

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.h
# Opt level: O2

void bloomfilter::applyBlock(uint32_t *tmp,int block,int len,uint64_t *data)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)len;
  if (len < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    data[tmp[(long)(block << 0xf) + uVar2] >> 6] =
         data[tmp[(long)(block << 0xf) + uVar2] >> 6] |
         1L << ((byte)tmp[(long)(block << 0xf) + uVar2] & 0x3f);
  }
  return;
}

Assistant:

void applyBlock(uint32_t *tmp, int block, int len, uint64_t *data) {
  for (int i = 0; i < len; i++) {
    uint32_t index = tmp[(block << blockShift) + i];
    data[index >> 6] |= getBit(index);
  }
}